

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma2_encoder.c
# Opt level: O3

lzma_ret lzma2_encoder_init(lzma_lz_encoder *lz,lzma_allocator *allocator,void *options,
                           lzma_lz_options_conflict *lz_options)

{
  lzma_ret lVar1;
  undefined4 *puVar2;
  long lVar3;
  lzma_options_lzma *plVar4;
  bool bVar5;
  byte bVar6;
  
  bVar6 = 0;
  if (options == (void *)0x0) {
    return LZMA_PROG_ERROR;
  }
  puVar2 = (undefined4 *)lz->coder;
  if (puVar2 == (undefined4 *)0x0) {
    puVar2 = (undefined4 *)lzma_alloc(0x100a8,allocator);
    if (puVar2 == (undefined4 *)0x0) {
      return LZMA_MEM_ERROR;
    }
    lz->coder = puVar2;
    lz->code = lzma2_encode;
    lz->end = lzma2_encoder_end;
    lz->options_update = lzma2_encoder_options_update;
    *(undefined8 *)(puVar2 + 2) = 0;
  }
  plVar4 = (lzma_options_lzma *)(puVar2 + 4);
  for (lVar3 = 0xe; lVar3 != 0; lVar3 = lVar3 + -1) {
    *(undefined8 *)plVar4 = *options;
    options = (undefined8 *)((long)options + ((ulong)bVar6 * -2 + 1) * 8);
    plVar4 = (lzma_options_lzma *)((long)plVar4 + (ulong)bVar6 * -0x10 + 8);
  }
  *puVar2 = 0;
  *(undefined2 *)(puVar2 + 0x20) = 1;
  if (*(long *)(puVar2 + 6) == 0) {
    bVar5 = true;
  }
  else {
    bVar5 = puVar2[8] == 0;
  }
  *(bool *)((long)puVar2 + 0x82) = bVar5;
  lVar1 = lzma_lzma_encoder_create
                    ((void **)(puVar2 + 2),allocator,(lzma_options_lzma *)(puVar2 + 4),lz_options);
  if (lVar1 == LZMA_OK) {
    lVar1 = LZMA_OK;
    if (lz_options->before_size + lz_options->dict_size < 0x10000) {
      lz_options->before_size = 0x10000 - lz_options->dict_size;
    }
  }
  return lVar1;
}

Assistant:

static lzma_ret
lzma2_encoder_init(lzma_lz_encoder *lz, const lzma_allocator *allocator,
		const void *options, lzma_lz_options *lz_options)
{
	if (options == NULL)
		return LZMA_PROG_ERROR;

	lzma_lzma2_coder *coder = lz->coder;
	if (coder == NULL) {
		coder = lzma_alloc(sizeof(lzma_lzma2_coder), allocator);
		if (coder == NULL)
			return LZMA_MEM_ERROR;

		lz->coder = coder;
		lz->code = &lzma2_encode;
		lz->end = &lzma2_encoder_end;
		lz->options_update = &lzma2_encoder_options_update;

		coder->lzma = NULL;
	}

	coder->opt_cur = *(const lzma_options_lzma *)(options);

	coder->sequence = SEQ_INIT;
	coder->need_properties = true;
	coder->need_state_reset = false;
	coder->need_dictionary_reset
			= coder->opt_cur.preset_dict == NULL
			|| coder->opt_cur.preset_dict_size == 0;

	// Initialize LZMA encoder
	return_if_error(lzma_lzma_encoder_create(&coder->lzma, allocator,
			&coder->opt_cur, lz_options));

	// Make sure that we will always have enough history available in
	// case we need to use uncompressed chunks. They are used when the
	// compressed size of a chunk is not smaller than the uncompressed
	// size, so we need to have at least LZMA2_COMPRESSED_MAX bytes
	// history available.
	if (lz_options->before_size + lz_options->dict_size < LZMA2_CHUNK_MAX)
		lz_options->before_size
				= LZMA2_CHUNK_MAX - lz_options->dict_size;

	return LZMA_OK;
}